

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

int __thiscall QuantNet::get_conv_names(QuantNet *this)

{
  bool bVar1;
  value_type *pvVar2;
  reference ppLVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string name;
  Layer *layer;
  size_t i;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  value_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  value_type local_18;
  value_type *local_10;
  
  local_10 = (value_type *)0x0;
  while (__x = local_10,
        pvVar2 = (value_type *)
                 std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                           ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                            &in_RDI[2].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), __x < pvVar2) {
    ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                         &in_RDI[2].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)local_10);
    local_18 = *ppLVar3;
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (((bVar1) ||
        (bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), bVar1)) ||
       (bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), bVar1)) {
      in_stack_ffffffffffffffa0 = &local_38;
      std::__cxx11::string::string((string *)in_stack_ffffffffffffffa0,(string *)&local_18->name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_RDI,__x);
      std::__cxx11::string::~string((string *)&local_38);
    }
    local_10 = (value_type *)&local_10->field_0x1;
  }
  return 0;
}

Assistant:

int QuantNet::get_conv_names()
{
    for (size_t i=0; i<layers.size(); i++)
    {
        ncnn::Layer* layer = layers[i];
        
        if (layer->type == "Convolution" || layer->type == "ConvolutionDepthWise" || layer->type == "InnerProduct")
        {
            std::string name = layer->name;
            conv_names.push_back(name);
        }
    }        

    return 0;
}